

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>
::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap,Index columnIndex)

{
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  ID_index IVar3;
  reference ppEVar4;
  const_reference pvVar5;
  undefined1 local_50 [16];
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
  *local_40;
  Entry *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range3;
  Index columnIndex_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *valueMap_local;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_8UL,_void,_void>_>
  *this_local;
  
  boost::container::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
  ::begin((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
           *)&__end0);
  boost::container::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
  ::end((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
         *)&entry);
  while( true ) {
    bVar1 = boost::container::operator!=
                      (&__end0,(vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_**,_false>
                                *)&entry);
    if (!bVar1) break;
    ppEVar4 = boost::container::
              vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_**,_false>
              ::operator*(&__end0);
    local_40 = *ppEVar4;
    Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
    ::unlink((Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
              *)this,(char *)local_40);
    uVar2 = Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>
            ::get_null_value<unsigned_int>();
    if (columnIndex != uVar2) {
      Entry_column_index<unsigned_int>::set_column_index
                (&local_40->super_Entry_column_index_option,columnIndex);
    }
    this_00 = local_40;
    IVar3 = Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
            ::get_row_index(local_40);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(valueMap,(ulong)IVar3);
    Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
    ::set_row_index(this_00,*pvVar5);
    IVar3 = Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
            ::get_row_index(local_40);
    Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
    ::insert_entry((Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>
                    *)this,IVar3,local_40);
    boost::container::
    vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_**,_false>
    ::operator++(&__end0);
  }
  boost::container::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
  ::begin((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
           *)(local_50 + 8));
  boost::container::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
  ::end((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_false,_true>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
         *)local_50);
  std::
  sort<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>**,false>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>*,8ul,void,void>>::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&,unsigned_int)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,false,true>>>const*)_1_>
            (local_50 + 8,local_50);
  return;
}

Assistant:

inline void Naive_vector_column<Master_matrix,Support>::reorder(const Row_index_map& valueMap,
                                                        [[maybe_unused]] Index columnIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  for (Entry* entry : column_) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      RA_opt::unlink(entry);
      if (columnIndex != Master_matrix::template get_null_value<Index>()) entry->set_column_index(columnIndex);
    }
    entry->set_row_index(valueMap.at(entry->get_row_index()));
    if constexpr (Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access)
      RA_opt::insert_entry(entry->get_row_index(), entry);
  }

  // all entries have to be deleted first, to avoid problem with insertion when row is a set
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows && Master_matrix::Option_list::has_row_access) {
    for (Entry* entry : column_) {
      RA_opt::insert_entry(entry->get_row_index(), entry);
    }
  }

  std::sort(column_.begin(), column_.end(), [](const Entry* c1, const Entry* c2) { return *c1 < *c2; });
}